

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_servergreet_resp(Curl_easy *data,int smtpcode,smtpstate instate)

{
  CURLcode local_1c;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  Curl_easy *data_local;
  
  if (smtpcode / 100 == 2) {
    local_1c = smtp_perform_ehlo(data);
  }
  else {
    Curl_failf(data,"Got unexpected smtp-server response: %d",(ulong)(uint)smtpcode);
    local_1c = CURLE_WEIRD_SERVER_REPLY;
  }
  return local_1c;
}

Assistant:

static CURLcode smtp_state_servergreet_resp(struct Curl_easy *data,
                                            int smtpcode,
                                            smtpstate instate)
{
  CURLcode result = CURLE_OK;
  (void)instate; /* no use for this yet */

  if(smtpcode/100 != 2) {
    failf(data, "Got unexpected smtp-server response: %d", smtpcode);
    result = CURLE_WEIRD_SERVER_REPLY;
  }
  else
    result = smtp_perform_ehlo(data);

  return result;
}